

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int xpath_round(lyxp_set **args,uint16_t UNUSED_arg_count,lyd_node *cur_node,lys_module *param_4,
               lyxp_set *set,int options)

{
  longdouble lVar1;
  uint uVar2;
  lyxp_set *set_00;
  longdouble lVar3;
  int iVar4;
  int iVar5;
  lys_node *plVar6;
  char *format;
  long lVar7;
  uint32_t uVar8;
  ly_ctx *ctx;
  lyd_node *plVar9;
  longdouble lVar10;
  
  set_00 = *args;
  if ((options & 0x1cU) == 0) {
    iVar4 = lyxp_set_cast(set_00,LYXP_SET_NUMBER,cur_node,param_4,options);
    if (iVar4 != 0) {
      return -1;
    }
    lVar1 = ((*args)->val).num;
    lVar3 = (longdouble)0;
    lVar10 = -lVar3;
    if (((lVar1 != lVar3) || (NAN(lVar1) || NAN(lVar3))) &&
       (lVar3 <= lVar1 || lVar1 < (longdouble)-0.5)) {
      ((*args)->val).num = lVar1 + (longdouble)0.5;
      iVar4 = xpath_floor(args,0,cur_node,param_4,*args,options);
      if (iVar4 != 0) {
        return -1;
      }
      lVar10 = ((*args)->val).num;
    }
    set_free_content(set);
    set->type = LYXP_SET_NUMBER;
    (set->val).num = lVar10;
    return 0;
  }
  if (set_00->type == LYXP_SET_SNODE_SET) {
    uVar8 = set_00->used;
    plVar9 = (lyd_node *)0x0;
    do {
      uVar8 = uVar8 - 1;
      if ((set_00->val).nodes[uVar8].pos == 1) {
        plVar9 = (set_00->val).nodes[uVar8].node;
        break;
      }
    } while (uVar8 != 0);
    if (plVar9 != (lyd_node *)0x0) {
      if ((*(LYS_NODE *)&plVar9->ht & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
        ctx = param_4->ctx;
        plVar6 = (lys_node *)strnodetype(*(LYS_NODE *)&plVar9->ht);
        format = "Argument #1 of %s is a %s node \"%s\".";
      }
      else {
        iVar5 = warn_is_specific_type((lys_type *)&plVar9[1].ht,LY_TYPE_DEC64);
        iVar4 = 0;
        if (iVar5 != 0) goto LAB_00180d3f;
        ctx = param_4->ctx;
        plVar6 = plVar9->schema;
        format = "Argument #1 of %s is node \"%s\", not of type \"decimal64\".";
      }
      iVar4 = 1;
      ly_log(ctx,LY_LLWRN,LY_SUCCESS,format,"xpath_round",plVar6);
      goto LAB_00180d3f;
    }
  }
  iVar4 = 1;
  ly_log(param_4->ctx,LY_LLWRN,LY_SUCCESS,"Argument #1 of %s not a node-set as expected.",
         "xpath_round");
LAB_00180d3f:
  uVar2 = set->used;
  if ((ulong)uVar2 != 0) {
    lVar7 = 0;
    do {
      if (*(int *)((long)&((set->val).nodes)->pos + lVar7) == 1) {
        *(undefined4 *)((long)&((set->val).nodes)->pos + lVar7) = 0;
      }
      lVar7 = lVar7 + 0x10;
    } while ((ulong)uVar2 << 4 != lVar7);
  }
  return iVar4;
}

Assistant:

static int
xpath_round(struct lyxp_set **args, uint16_t UNUSED(arg_count), struct lyd_node *cur_node, struct lys_module *local_mod,
            struct lyxp_set *set, int options)
{
    struct lys_node_leaf *sleaf;
    int ret = EXIT_SUCCESS;

    if (options & LYXP_SNODE_ALL) {
        if ((args[0]->type != LYXP_SET_SNODE_SET) || !(sleaf = (struct lys_node_leaf *)warn_get_snode_in_ctx(args[0]))) {
            LOGWRN(local_mod->ctx, "Argument #1 of %s not a node-set as expected.", __func__);
            ret = EXIT_FAILURE;
        } else if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
            LOGWRN(local_mod->ctx, "Argument #1 of %s is a %s node \"%s\".", __func__, strnodetype(sleaf->nodetype), sleaf->name);
            ret = EXIT_FAILURE;
        } else if (!warn_is_specific_type(&sleaf->type, LY_TYPE_DEC64)) {
            LOGWRN(local_mod->ctx, "Argument #1 of %s is node \"%s\", not of type \"decimal64\".", __func__, sleaf->name);
            ret = EXIT_FAILURE;
        }
        set_snode_clear_ctx(set);
        return ret;
    }

    if (lyxp_set_cast(args[0], LYXP_SET_NUMBER, cur_node, local_mod, options)) {
        return -1;
    }

    /* cover only the cases where floor can't be used */
    if ((args[0]->val.num == -0.0f) || ((args[0]->val.num < 0) && (args[0]->val.num >= -0.5))) {
        set_fill_number(set, -0.0f);
    } else {
        args[0]->val.num += 0.5;
        if (xpath_floor(args, 1, cur_node, local_mod, args[0], options)) {
            return -1;
        }
        set_fill_number(set, args[0]->val.num);
    }

    return EXIT_SUCCESS;
}